

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O2

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Get
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  switch(this->fieldSize) {
  case '\0':
    if ((this->fields).ptr != (Fields *)0x0) goto switchD_006d9e6b_caseD_3;
    goto LAB_006d9ebf;
  case '\x01':
    uVar3 = (uint)(byte)(this->fields).ptr[typeEnum];
    break;
  case '\x02':
    uVar3 = (uint)*(ushort *)((this->fields).ptr + (ulong)typeEnum * 2);
    break;
  default:
switchD_006d9e6b_caseD_3:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x46,"(localFieldSize == 0 && this->fields == nullptr)",
                                "localFieldSize == 0 && this->fields == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
LAB_006d9ebf:
    uVar3 = 0;
    break;
  case '\x04':
    uVar3 = *(uint *)((this->fields).ptr + (ulong)typeEnum * 4);
  }
  return uVar3;
}

Assistant:

uint32 Get(CountT typeEnum) const
        {
            uint8 type = static_cast<uint8>(typeEnum);
            uint8 localFieldSize = fieldSize;
            uint32 value = 0;
            if (localFieldSize == 1)
            {
                value = this->fields->u8Fields[type];
            }
            else if (localFieldSize == 2)
            {
                value = this->fields->u16Fields[type];
            }
            else if (localFieldSize == 4)
            {
                value = this->fields->u32Fields[type];
            }
            else
            {
                Assert(localFieldSize == 0 && this->fields == nullptr); // OOM when initial allocation failed
            }

            return value;
        }